

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

int __thiscall
QDockAreaLayoutInfo::separatorMove
          (QDockAreaLayoutInfo *this,QList<int> *separator,QPoint *origin,QPoint *dest)

{
  long lVar1;
  QDockAreaLayoutInfo *p1;
  QList<int> *in_RCX;
  QDockAreaLayoutInfo *in_RDX;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int in_stack_00000008;
  int in_stack_0000000c;
  QDockAreaLayoutInfo *in_stack_00000010;
  QDockAreaLayoutInfo *info;
  int index;
  int delta;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Orientation o;
  undefined4 in_stack_ffffffffffffffb8;
  int local_34;
  
  o = (Orientation)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<int>::last((QList<int> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  p1 = QDockAreaLayoutInfo::info(in_RDX,in_RCX);
  ::operator-((QPoint *)p1,(QPoint *)CONCAT44(p1->o,in_stack_ffffffffffffffb8));
  local_34 = pick(o,(QPoint *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (local_34 != 0) {
    local_34 = separatorMove(in_stack_00000010,in_stack_0000000c,in_stack_00000008);
  }
  apply((QDockAreaLayoutInfo *)origin,dest._7_1_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_34;
  }
  __stack_chk_fail();
}

Assistant:

int QDockAreaLayoutInfo::separatorMove(const QList<int> &separator, const QPoint &origin,
                                       const QPoint &dest)
{
    int delta = 0;
    int index = separator.last();
    QDockAreaLayoutInfo *info = this->info(separator);
    delta = pick(info->o, dest - origin);
    if (delta != 0)
        delta = info->separatorMove(index, delta);
    info->apply(false);
    return delta;
}